

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# declaration.cc
# Opt level: O2

void __thiscall
tchecker::parsing::location_declaration_t::~location_declaration_t(location_declaration_t *this)

{
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->_process).
              super___shared_ptr<const_tchecker::parsing::process_declaration_t,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__cxx11::string::~string((string *)&this->_name);
  inner_declaration_t::~inner_declaration_t(&this->super_inner_declaration_t);
  return;
}

Assistant:

location_declaration_t::~location_declaration_t() = default;